

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void groupConcatInverse(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  void *pvVar2;
  undefined8 *in_RDX;
  int nVS;
  GroupConcatCtx *pGCC;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  iVar1 = sqlite3_value_type((sqlite3_value *)*in_RDX);
  if ((iVar1 != 5) &&
     (pvVar2 = sqlite3_aggregate_context
                         ((sqlite3_context *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0),
     pvVar2 != (void *)0x0)) {
    sqlite3_value_text((sqlite3_value *)0x2261e1);
    iVar1 = sqlite3_value_bytes((sqlite3_value *)0x2261ee);
    *(int *)((long)pvVar2 + 0x20) = *(int *)((long)pvVar2 + 0x20) + -1;
    if (*(long *)((long)pvVar2 + 0x28) == 0) {
      iVar1 = *(int *)((long)pvVar2 + 0x24) + iVar1;
    }
    else if (0 < *(int *)((long)pvVar2 + 0x20)) {
      iVar1 = **(int **)((long)pvVar2 + 0x28) + iVar1;
      memmove(*(void **)((long)pvVar2 + 0x28),(void *)(*(long *)((long)pvVar2 + 0x28) + 4),
              (long)(*(int *)((long)pvVar2 + 0x20) + -1) << 2);
    }
    if (iVar1 < *(int *)((long)pvVar2 + 0x18)) {
      *(int *)((long)pvVar2 + 0x18) = *(int *)((long)pvVar2 + 0x18) - iVar1;
      memmove(*(void **)((long)pvVar2 + 8),(void *)(*(long *)((long)pvVar2 + 8) + (long)iVar1),
              (ulong)*(uint *)((long)pvVar2 + 0x18));
    }
    else {
      *(undefined4 *)((long)pvVar2 + 0x18) = 0;
    }
    if (*(int *)((long)pvVar2 + 0x18) == 0) {
      *(undefined4 *)((long)pvVar2 + 0x14) = 0;
      sqlite3_free((void *)0x2262e4);
      *(undefined8 *)((long)pvVar2 + 0x28) = 0;
    }
  }
  return;
}

Assistant:

static void groupConcatInverse(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GroupConcatCtx *pGCC;
  assert( argc==1 || argc==2 );
  (void)argc;  /* Suppress unused parameter warning */
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  pGCC = (GroupConcatCtx*)sqlite3_aggregate_context(context, sizeof(*pGCC));
  /* pGCC is always non-NULL since groupConcatStep() will have always
  ** run first to initialize it */
  if( ALWAYS(pGCC) ){
    int nVS;  /* Number of characters to remove */
    /* Must call sqlite3_value_text() to convert the argument into text prior
    ** to invoking sqlite3_value_bytes(), in case the text encoding is UTF16 */
    (void)sqlite3_value_text(argv[0]);
    nVS = sqlite3_value_bytes(argv[0]);
    pGCC->nAccum -= 1;
    if( pGCC->pnSepLengths!=0 ){
      assert(pGCC->nAccum >= 0);
      if( pGCC->nAccum>0 ){
        nVS += *pGCC->pnSepLengths;
        memmove(pGCC->pnSepLengths, pGCC->pnSepLengths+1,
               (pGCC->nAccum-1)*sizeof(int));
      }
    }else{
      /* If removing single accumulated string, harmlessly over-do. */
      nVS += pGCC->nFirstSepLength;
    }
    if( nVS>=(int)pGCC->str.nChar ){
      pGCC->str.nChar = 0;
    }else{
      pGCC->str.nChar -= nVS;
      memmove(pGCC->str.zText, &pGCC->str.zText[nVS], pGCC->str.nChar);
    }
    if( pGCC->str.nChar==0 ){
      pGCC->str.mxAlloc = 0;
      sqlite3_free(pGCC->pnSepLengths);
      pGCC->pnSepLengths = 0;
    }
  }
}